

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_ptr.hpp
# Opt level: O2

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<char_const*,void>::operator()
          (void *this,packer<msgpack::v1::sbuffer> *o,char *v)

{
  size_t size;
  
  size = strlen(v);
  detail::check_container_size<8ul>(size);
  packer<msgpack::v1::sbuffer>::pack_str(o,(uint32_t)size);
  packer<msgpack::v1::sbuffer>::append_buffer(o,v,size & 0xffffffff);
  return o;
}

Assistant:

msgpack::packer<Stream>& operator()(msgpack::packer<Stream>& o, const char* v) const {
        uint32_t size = checked_get_container_size(std::strlen(v));
        o.pack_str(size);
        o.pack_str_body(v, size);
        return o;
    }